

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

uint aom_highbd_12_masked_sub_pixel_variance64x16_ssse3
               (uint8_t *src8,int src_stride,int xoffset,int yoffset,uint8_t *ref8,int ref_stride,
               uint8_t *second_pred8,uint8_t *msk,int msk_stride,int invert_mask,uint32_t *sse)

{
  int iVar1;
  long lVar2;
  int in_stack_00000020;
  uint *in_stack_00000028;
  uint16_t *second_pred;
  uint16_t *ref;
  uint16_t *src;
  uint16_t temp [1088];
  int64_t var;
  int sum;
  uint64_t sse64;
  undefined4 local_8ec;
  int in_stack_fffffffffffff804;
  uint16_t *in_stack_fffffffffffff808;
  int in_stack_fffffffffffff814;
  int in_stack_fffffffffffff818;
  int in_stack_fffffffffffff81c;
  undefined4 in_stack_fffffffffffff820;
  int in_stack_fffffffffffff824;
  uint16_t *in_stack_fffffffffffff828;
  int in_stack_fffffffffffff9c0;
  uint8_t *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  uint64_t *in_stack_fffffffffffffce0;
  int *in_stack_fffffffffffffce8;
  undefined4 local_3c;
  undefined8 local_38;
  
  highbd_bilinear_filter
            ((uint16_t *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
             in_stack_fffffffffffff81c,in_stack_fffffffffffff818,in_stack_fffffffffffff814,
             in_stack_fffffffffffff808,in_stack_fffffffffffff804,in_stack_fffffffffffff9c0);
  if (in_stack_00000020 == 0) {
    highbd_masked_variance
              (in_stack_fffffffffffff828,in_stack_fffffffffffff824,
               (uint16_t *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),
               in_stack_fffffffffffff814,in_stack_fffffffffffff808,in_stack_fffffffffffff804,
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0,in_stack_fffffffffffffce8);
  }
  else {
    highbd_masked_variance
              (in_stack_fffffffffffff828,in_stack_fffffffffffff824,
               (uint16_t *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),
               in_stack_fffffffffffff814,in_stack_fffffffffffff808,in_stack_fffffffffffff804,
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0,in_stack_fffffffffffffce8);
  }
  *in_stack_00000028 = (uint)((ulong)(local_38 + 0x80) >> 8);
  iVar1 = local_3c + 8 >> 4;
  lVar2 = (ulong)*in_stack_00000028 - ((long)iVar1 * (long)iVar1) / 0x400;
  if (lVar2 < 0) {
    local_8ec = 0;
  }
  else {
    local_8ec = (uint)lVar2;
  }
  return local_8ec;
}

Assistant:

static inline __m128i highbd_filter_block(const __m128i a, const __m128i b,
                                          const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi16(a, b);
  v0 = _mm_madd_epi16(v0, filter);
  v0 = xx_roundn_epu32(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi16(a, b);
  v1 = _mm_madd_epi16(v1, filter);
  v1 = xx_roundn_epu32(v1, FILTER_BITS);

  return _mm_packs_epi32(v0, v1);
}